

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Bac_NtkTransformToPtr(Bac_Ntk_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  char *Entry;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vNtk;
  Bac_Ntk_t *p_local;
  
  p_00 = Vec_PtrAllocExact(5);
  Entry = Bac_NtkName(p);
  Vec_PtrPush(p_00,Entry);
  pVVar2 = Bac_NtkTransformToPtrInputs(p);
  Vec_PtrPush(p_00,pVVar2);
  pVVar2 = Bac_NtkTransformToPtrOutputs(p);
  Vec_PtrPush(p_00,pVVar2);
  pVVar2 = Vec_PtrAllocExact(0);
  Vec_PtrPush(p_00,pVVar2);
  pVVar2 = Bac_NtkTransformToPtrBoxes(p);
  Vec_PtrPush(p_00,pVVar2);
  iVar1 = Ptr_CheckArray(p_00);
  if (iVar1 != 0) {
    return p_00;
  }
  __assert_fail("Ptr_CheckArray(vNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x1c8,"Vec_Ptr_t *Bac_NtkTransformToPtr(Bac_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtr( Bac_Ntk_t * p )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact(5);
    Vec_PtrPush( vNtk, Bac_NtkName(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrInputs(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrOutputs(p) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrBoxes(p) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}